

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<char16_t> * __thiscall
kj::ArrayBuilder<char16_t>::operator=(ArrayBuilder<char16_t> *this,ArrayBuilder<char16_t> *other)

{
  char16_t *pcVar1;
  RemoveConst<char16_t> *pRVar2;
  char16_t *pcVar3;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char16_t *)0x0) {
    pRVar2 = this->pos;
    pcVar3 = this->endPtr;
    this->ptr = (char16_t *)0x0;
    this->pos = (RemoveConst<char16_t> *)0x0;
    this->endPtr = (char16_t *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pcVar1,2,(long)pRVar2 - (long)pcVar1 >> 1,
               (long)pcVar3 - (long)pcVar1 >> 1,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char16_t *)0x0;
  other->pos = (RemoveConst<char16_t> *)0x0;
  other->endPtr = (char16_t *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }